

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TQualifier::isArrayedIo(TQualifier *this,EShLanguage language)

{
  byte bVar1;
  ulong uVar3;
  uint uVar2;
  
  switch(language) {
  case EShLangTessControl:
    if (((*(ulong *)&this->field_0x8 >> 0x2c & 1) == 0) &&
       (uVar2 = (uint)*(ulong *)&this->field_0x8 & 0x7f, bVar1 = (byte)uVar2, uVar2 < 0x1f)) {
      uVar2 = 0x7ff00018;
LAB_003f779a:
      bVar1 = (byte)(uVar2 >> (bVar1 & 0x1f));
      goto LAB_003f77a0;
    }
    break;
  case EShLangTessEvaluation:
    uVar3 = *(ulong *)&this->field_0x8;
    if ((uVar3 >> 0x2c & 1) == 0) {
LAB_003f778d:
      uVar2 = (uint)uVar3 & 0x7f;
      bVar1 = (byte)uVar2;
      if (uVar2 < 0x1c) {
        uVar2 = 0xe300008;
        goto LAB_003f779a;
      }
    }
    break;
  case EShLangGeometry:
    uVar2 = *(uint *)&this->field_0x8 & 0x7f;
    bVar1 = (byte)uVar2;
    if (uVar2 < 0x1c) {
      uVar2 = 0xe300008;
      goto LAB_003f779a;
    }
    break;
  case EShLangFragment:
    uVar3 = *(ulong *)&this->field_0x8;
    if ((uVar3 & 0x18000000000) != 0) goto LAB_003f778d;
    break;
  default:
    if (((language == EShLangMesh) && ((*(ulong *)&this->field_0x8 >> 0x2b & 1) == 0)) &&
       (uVar2 = (uint)*(ulong *)&this->field_0x8 & 0x7f, bVar1 = (byte)uVar2, uVar2 < 0x1f)) {
      uVar2 = 0x71c00010;
      goto LAB_003f779a;
    }
  }
  bVar1 = 0;
LAB_003f77a0:
  return (bool)(bVar1 & 1);
}

Assistant:

bool isArrayedIo(EShLanguage language) const
    {
        switch (language) {
        case EShLangGeometry:
            return isPipeInput();
        case EShLangTessControl:
            return ! patch && (isPipeInput() || isPipeOutput());
        case EShLangTessEvaluation:
            return ! patch && isPipeInput();
        case EShLangFragment:
            return (pervertexNV || pervertexEXT) && isPipeInput();
        case EShLangMesh:
            return ! perTaskNV && isPipeOutput();

        default:
            return false;
        }
    }